

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O1

void __thiscall xemmai::ast::t_object_get::f_method(t_object_get *this,t_emit *a_emit)

{
  t_node *ptVar1;
  t_code *ptVar2;
  size_t sVar3;
  ulong uVar4;
  t_object *local_20;
  
  ptVar1 = (this->v_target)._M_t.
           super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>.
           _M_t.
           super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
           super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
  (*ptVar1->_vptr_t_node[3])(ptVar1,a_emit,0,0,0);
  t_emit::f_emit_safe_point(a_emit,&this->super_t_node);
  a_emit->v_stack = a_emit->v_stack - 1;
  local_20 = (t_object *)t_code::v_labels[0xd];
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_20);
  local_20 = (t_object *)a_emit->v_stack;
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_20);
  local_20 = this->v_key;
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_20);
  local_20 = (t_object *)0x0;
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_20);
  ptVar2 = a_emit->v_code;
  sVar3 = a_emit->v_stack;
  uVar4 = sVar3 + 1;
  a_emit->v_stack = uVar4;
  if (ptVar2->v_size < uVar4) {
    ptVar2->v_size = uVar4;
  }
  uVar4 = sVar3 + 2;
  a_emit->v_stack = uVar4;
  if (ptVar2->v_size < uVar4) {
    ptVar2->v_size = uVar4;
  }
  t_emit::f_at(a_emit,&this->super_t_node);
  return;
}

Assistant:

void t_object_get::f_method(t_emit& a_emit)
{
	v_target->f_emit(a_emit, false, false);
	a_emit.f_emit_safe_point(this);
	a_emit.f_pop();
	a_emit << c_instruction__METHOD_GET << a_emit.v_stack << v_key << 0;
	a_emit.f_push().f_push();
	a_emit.f_at(this);
}